

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O3

void ssh1_throttle_all_channels(ConnectionLayer *cl,_Bool throttled)

{
  void *pvVar1;
  int index;
  
  pvVar1 = index234((tree234 *)cl[-0xd].vt,0);
  if (pvVar1 != (void *)0x0) {
    index = 1;
    do {
      (**(code **)(**(long **)((long)pvVar1 + 0x20) + 0x28))
                (*(long **)((long)pvVar1 + 0x20),!throttled);
      pvVar1 = index234((tree234 *)cl[-0xd].vt,index);
      index = index + 1;
    } while (pvVar1 != (void *)0x0);
  }
  return;
}

Assistant:

static void ssh1_throttle_all_channels(ConnectionLayer *cl, bool throttled)
{
    struct ssh1_connection_state *s =
        container_of(cl, struct ssh1_connection_state, cl);
    struct ssh1_channel *c;
    int i;

    for (i = 0; NULL != (c = index234(s->channels, i)); i++)
        chan_set_input_wanted(c->chan, !throttled);
}